

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[8],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[2],kj::StringPtr&,char_const(&)[14],kj::String&,char_const(&)[23],kj::String&,char_const(&)[37],capnp::(anonymous_namespace)::CppTypeName&,char_const(&)[58],unsigned_int&,char_const(&)[36]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [8],
          CppTypeName *params_2,char (*params_3) [2],StringPtr *params_4,char (*params_5) [14],
          String *params_6,char (*params_7) [23],String *params_8,char (*params_9) [37],
          CppTypeName *params_10,char (*params_11) [58],uint *params_12,char (*params_13) [36])

{
  char *pcVar1;
  CppTypeName *pCVar2;
  size_t sVar3;
  int iVar4;
  StringTree *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArrayPtr<const_char> *params_13_00;
  String local_128;
  String local_108;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined1 local_58 [40];
  
  local_78._16_8_ = "inline ";
  local_60 = 7;
  toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_108,(kj *)params,(CppTypeName *)params);
  local_78._0_8_ = " ";
  local_78._8_8_ = 1;
  local_88.ptr = *(char **)params_1;
  local_88.size_ = (long)params_1[1] - 1;
  local_98.ptr = "Builder::init";
  local_98.size_ = 0xd;
  pcVar1 = (params_2->name).text.content.ptr;
  local_a8.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_a8.ptr = (char *)(params_2->name).size_;
  }
  local_a8.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_a8.size_ = (size_t)(char *)0x0;
  }
  local_b8.ptr = "(unsigned int size) {\n";
  local_b8.size_ = 0x16;
  pCVar2 = *(CppTypeName **)(params_3 + 4);
  local_c8.ptr = (char *)pCVar2;
  if (pCVar2 != (CppTypeName *)0x0) {
    local_c8.ptr = *(char **)params_3;
  }
  local_c8.size_ = (size_t)&pCVar2[-1].field_0x3f;
  if (pCVar2 == (CppTypeName *)0x0) {
    local_c8.size_ = (size_t)(char *)0x0;
  }
  local_e8._16_8_ = "  return ::capnp::_::PointerHelpers<";
  local_d0 = 0x24;
  toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            (&local_128,(kj *)params_4,(CppTypeName *)local_c8.ptr);
  local_e8._0_8_ = ">::init(_builder.getPointerField(\n      ::capnp::bounded<";
  local_e8._8_8_ = 0x39;
  params_13_00 = (ArrayPtr<const_char> *)0x1786f7;
  _::Stringifier::operator*
            ((CappedArray<char,_14UL> *)(local_58 + 0x10),(Stringifier *)&_::STR,*(uint *)*params_5)
  ;
  local_58._0_8_ = ">() * ::capnp::POINTERS), size);\n}\n";
  local_58[8] = '#';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  pSVar5 = StringTree::
           concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
                     (__return_storage_ptr__,(StringTree *)this,(StringTree *)(local_78 + 0x10),
                      (ArrayPtr<const_char> *)&local_108,(String *)local_78,&local_88,&local_98,
                      &local_a8,&local_b8,&local_c8,(ArrayPtr<const_char> *)(local_e8 + 0x10),
                      (ArrayPtr<const_char> *)&local_128,(String *)local_e8,
                      (ArrayPtr<const_char> *)(local_58 + 0x10),(CappedArray<char,_14UL> *)local_58,
                      params_13_00);
  sVar3 = local_128.content.size_;
  pcVar1 = local_128.content.ptr;
  if (local_128.content.ptr != (char *)0x0) {
    local_128.content.ptr = (char *)0x0;
    local_128.content.size_ = 0;
    iVar4 = (**(local_128.content.disposer)->_vptr_ArrayDisposer)
                      (local_128.content.disposer,pcVar1,1,sVar3,sVar3,0);
    pSVar5 = (StringTree *)CONCAT44(extraout_var,iVar4);
  }
  sVar3 = local_108.content.size_;
  pcVar1 = local_108.content.ptr;
  if (local_108.content.ptr != (char *)0x0) {
    local_108.content.ptr = (char *)0x0;
    local_108.content.size_ = 0;
    iVar4 = (**(local_108.content.disposer)->_vptr_ArrayDisposer)
                      (local_108.content.disposer,pcVar1,1,sVar3,sVar3,0);
    pSVar5 = (StringTree *)CONCAT44(extraout_var_00,iVar4);
  }
  return pSVar5;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}